

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  ushort uVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  StkId pTVar4;
  int *piVar5;
  int iVar6;
  char *pcVar7;
  ravi_type_map type;
  StkId pos;
  TString *usertype;
  ravi_type_map local_24;
  StkId local_20;
  TString *local_18;
  
  local_20 = (StkId)0x0;
  iVar6 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar6 + 1;
  if (iVar6 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xd4,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
  }
  if (L->status == '\x01') {
    pCVar2 = L->ci;
    pTVar3 = L->stack;
    pTVar4 = pCVar2->func;
    pCVar2->func = (StkId)((long)&pTVar3->value_ + pCVar2->extra);
    pCVar2->extra = (long)pTVar4 - (long)pTVar3;
  }
  pcVar7 = findlocal(L,ar->i_ci,n,&local_20,&local_24,&local_18);
  if (pcVar7 != (char *)0x0) {
    iVar6 = raviV_checktype(L,L->top + -1,local_24,local_18);
    if (iVar6 != 0) {
      pTVar3 = L->top;
      local_20->value_ = pTVar3[-1].value_;
      uVar1 = pTVar3[-1].tt_;
      local_20->tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)((local_20->value_).gc)->tt ||
          ((L != (lua_State *)0x0 &&
           ((((local_20->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xdf,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
      }
      L->top = L->top + -1;
      goto LAB_001295a8;
    }
  }
  pcVar7 = (char *)0x0;
LAB_001295a8:
  if (L->status == '\x01') {
    pCVar2 = L->ci;
    pTVar3 = L->stack;
    pTVar4 = pCVar2->func;
    pCVar2->func = (StkId)((long)&pTVar3->value_ + pCVar2->extra);
    pCVar2->extra = (long)pTVar4 - (long)pTVar3;
  }
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return pcVar7;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0xe6,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  StkId pos = NULL;  /* to avoid warnings */
  const char *name;
  ravi_type_map type;
  TString* usertype;
  int compatible = 1;
  lua_lock(L);
  swapextra(L);
  name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
  if (name) {
    /* RAVI extension
    ** We need to ensure that this function does
    ** not subvert the types of local variables
    */
    StkId input = L->top - 1;
    int compatible = raviV_checktype(L, input, type, usertype);
    if (compatible) {
      setobjs2s(L, pos, L->top - 1);
      L->top--;  /* pop value */
    }
    else
      name = NULL;
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}